

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::color4d> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::color4d>
          (optional<tinyusdz::value::color4d> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<tinyusdz::value::color4d> local_40;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<tinyusdz::value::color4d>(&local_40,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_40.has_value_;
    if (local_40.has_value_ != true) {
      return __return_storage_ptr__;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_40.contained._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_40.contained._24_8_;
    *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
         local_40.contained.data.__align;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_40.contained._8_8_;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  *(undefined8 *)&__return_storage_ptr__->contained = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }